

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O3

void __thiscall
Network::copyCreditTransactions
          (Network *this,int index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *transactionInfo,CreditCard *toAdd)

{
  int iVar1;
  pointer pbVar2;
  char *pcVar3;
  CreditCard *this_00;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int unaff_R13D;
  int iVar9;
  ulong uVar10;
  char *local_68;
  int local_5c;
  ulong local_58;
  ulong local_50;
  Network *local_48;
  CreditCard *local_40;
  CreditCard *local_38;
  
  iVar9 = (int)&local_68;
  local_48 = this;
  this_00 = (CreditCard *)operator_new(0x80);
  CreditCard::CreditCard(this_00,toAdd);
  uVar8 = (ulong)(index + 1);
  pbVar2 = (transactionInfo->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = uVar8;
  if ((ulong)((long)(transactionInfo->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar8)
  goto LAB_00105440;
  pcVar3 = pbVar2[uVar8]._M_dataplus._M_p;
  local_58 = (ulong)(uint)index;
  local_50 = uVar8;
  local_40 = this_00;
  local_38 = toAdd;
  this_00 = (CreditCard *)__errno_location();
  local_5c = *(int *)&(this_00->super_Transaction)._vptr_Transaction;
  *(undefined4 *)&(this_00->super_Transaction)._vptr_Transaction = 0;
  lVar4 = strtol(pcVar3,&local_68,10);
  if (local_68 == pcVar3) {
    std::__throw_invalid_argument("stoi");
LAB_00105410:
    std::__throw_out_of_range("stoi");
LAB_0010541c:
    iVar9 = unaff_R13D;
    std::__throw_invalid_argument("stoi");
LAB_00105428:
    std::__throw_out_of_range("stoi");
    uVar10 = local_50;
    unaff_R13D = iVar9;
LAB_00105440:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
LAB_00105447:
    std::__throw_invalid_argument("stoi");
LAB_00105453:
    std::__throw_out_of_range("stoi");
LAB_0010545f:
    std::__throw_invalid_argument("stoi");
LAB_0010546b:
    std::__throw_out_of_range("stoi");
LAB_00105477:
    std::__throw_invalid_argument("stoi");
LAB_00105483:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar4 != lVar4) ||
       (unaff_R13D = *(int *)&(this_00->super_Transaction)._vptr_Transaction, unaff_R13D == 0x22))
    goto LAB_00105410;
    if (unaff_R13D == 0) {
      *(int *)&(this_00->super_Transaction)._vptr_Transaction = local_5c;
      unaff_R13D = local_5c;
    }
    lVar6 = 0x20;
    if ((int)lVar4 != 1) {
      pbVar2 = (transactionInfo->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = local_50;
      if ((ulong)((long)(transactionInfo->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= local_50
         ) goto LAB_00105440;
      pcVar3 = pbVar2[uVar8]._M_dataplus._M_p;
      *(undefined4 *)&(this_00->super_Transaction)._vptr_Transaction = 0;
      lVar4 = strtol(pcVar3,&local_68,10);
      if (local_68 == pcVar3) goto LAB_00105447;
      if ((lVar4 - 0x80000000U < 0xffffffff00000000) ||
         (iVar7 = *(int *)&(this_00->super_Transaction)._vptr_Transaction, iVar7 == 0x22))
      goto LAB_00105453;
      if (iVar7 == 0) {
        *(int *)&(this_00->super_Transaction)._vptr_Transaction = unaff_R13D;
        iVar7 = unaff_R13D;
      }
      lVar6 = 0x28;
      if ((int)lVar4 == 2) goto LAB_00105222;
      pbVar2 = (transactionInfo->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = local_50;
      if ((ulong)((long)(transactionInfo->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= local_50
         ) goto LAB_00105440;
      pcVar3 = pbVar2[uVar8]._M_dataplus._M_p;
      *(undefined4 *)&(this_00->super_Transaction)._vptr_Transaction = 0;
      lVar4 = strtol(pcVar3,&local_68,10);
      if (local_68 == pcVar3) goto LAB_00105477;
      if ((0xfffffffeffffffff < lVar4 - 0x80000000U) &&
         (iVar1 = *(int *)&(this_00->super_Transaction)._vptr_Transaction, iVar1 != 0x22)) {
        if (iVar1 == 0) {
          *(int *)&(this_00->super_Transaction)._vptr_Transaction = iVar7;
        }
        lVar6 = 0x30;
        if ((int)lVar4 == 3) goto LAB_00105222;
        goto LAB_00105235;
      }
      goto LAB_00105483;
    }
LAB_00105222:
    Peer::addTransaction
              (*(Peer **)((long)&(local_48->peers).size + lVar6),&local_38->super_Transaction);
LAB_00105235:
    uVar10 = (ulong)((int)local_58 + 2);
    pbVar2 = (transactionInfo->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(transactionInfo->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar10)
    goto LAB_00105440;
    pcVar3 = pbVar2[uVar10]._M_dataplus._M_p;
    local_58 = CONCAT44(local_58._4_4_,
                        *(undefined4 *)&(this_00->super_Transaction)._vptr_Transaction);
    *(undefined4 *)&(this_00->super_Transaction)._vptr_Transaction = 0;
    lVar4 = strtol(pcVar3,&local_68,10);
    unaff_R13D = (int)&local_68;
    if (local_68 == pcVar3) goto LAB_0010541c;
    if ((lVar4 - 0x80000000U < 0xffffffff00000000) ||
       (iVar9 = *(int *)&(this_00->super_Transaction)._vptr_Transaction, iVar9 == 0x22))
    goto LAB_00105428;
    if (iVar9 == 0) {
      *(int *)&(this_00->super_Transaction)._vptr_Transaction = (int)local_58;
      iVar9 = (int)local_58;
    }
    lVar6 = 0x20;
    if ((int)lVar4 == 1) goto LAB_001053bf;
    pbVar2 = (transactionInfo->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    unaff_R13D = iVar9;
    if ((ulong)((long)(transactionInfo->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar10)
    goto LAB_00105440;
    pcVar3 = pbVar2[uVar10]._M_dataplus._M_p;
    *(undefined4 *)&(this_00->super_Transaction)._vptr_Transaction = 0;
    lVar4 = strtol(pcVar3,&local_68,10);
    if (local_68 == pcVar3) goto LAB_0010545f;
    if ((lVar4 - 0x80000000U < 0xffffffff00000000) ||
       (iVar7 = *(int *)&(this_00->super_Transaction)._vptr_Transaction, iVar7 == 0x22))
    goto LAB_0010546b;
    unaff_R13D = iVar7;
    if (iVar7 == 0) {
      *(int *)&(this_00->super_Transaction)._vptr_Transaction = iVar9;
      unaff_R13D = iVar9;
    }
    lVar6 = 0x28;
    if ((int)lVar4 == 2) {
LAB_001053bf:
      Peer::addTransaction
                (*(Peer **)((long)&(local_48->peers).size + lVar6),&local_40->super_Transaction);
      return;
    }
    pbVar2 = (transactionInfo->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(transactionInfo->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar10)
    goto LAB_00105440;
    pcVar3 = pbVar2[uVar10]._M_dataplus._M_p;
    *(undefined4 *)&(this_00->super_Transaction)._vptr_Transaction = 0;
    lVar4 = strtol(pcVar3,&local_68,10);
    if (local_68 != pcVar3) {
      if ((0xfffffffeffffffff < lVar4 - 0x80000000U) &&
         (iVar9 = *(int *)&(this_00->super_Transaction)._vptr_Transaction, iVar9 != 0x22)) {
        if (iVar9 == 0) {
          *(int *)&(this_00->super_Transaction)._vptr_Transaction = unaff_R13D;
        }
        lVar6 = 0x30;
        if ((int)lVar4 != 3) {
          return;
        }
        goto LAB_001053bf;
      }
      goto LAB_0010549b;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0010549b:
  uVar5 = std::__throw_out_of_range("stoi");
  if (*(int *)&(this_00->super_Transaction)._vptr_Transaction == 0) {
    *(int *)&(this_00->super_Transaction)._vptr_Transaction = unaff_R13D;
  }
  _Unwind_Resume(uVar5);
}

Assistant:

void Network::copyCreditTransactions(int index, vector<string> transactionInfo, CreditCard *toAdd)
{
    CreditCard *copyToAdd;
    copyToAdd = new CreditCard(*toAdd);
//finds which peer to add the transaction to
    if(stoi(transactionInfo.at(index + 1)) == 1)
    {
        peer1->addTransaction(toAdd);
    }
    else if(stoi(transactionInfo.at(index + 1)) == 2)
    {
        peer2->addTransaction(toAdd);
    }
    else if(stoi(transactionInfo.at(index + 1)) == 3)
    {
        peer3->addTransaction(toAdd);
    }
    //finds which peer to add the copy of the transaction to
    if(stoi(transactionInfo.at(index + 2)) == 1)
    {
        peer1->addTransaction(copyToAdd);
    }
    else if(stoi(transactionInfo.at(index + 2)) == 2)
    {
        peer2->addTransaction(copyToAdd);
    }
    else if(stoi(transactionInfo.at(index + 2)) == 3)
    {
        peer3->addTransaction(copyToAdd);
    }
}